

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::BeginTabBarEx(ImGuiTabBar *tab_bar,ImRect *tab_bar_bb,ImGuiTabBarFlags flags)

{
  ImVec2 IVar1;
  bool bVar2;
  ImGuiWindow *pIVar3;
  ImGuiTabBar *pIVar4;
  ImGuiContext *pIVar5;
  int iVar6;
  ImU32 col;
  size_t __nmemb;
  uint uVar7;
  float fVar8;
  undefined1 local_48 [8];
  ImPoolIdx local_40;
  ImVec2 local_38;
  
  pIVar5 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  bVar2 = pIVar3->SkipItems;
  if (bVar2 == false) {
    if (((uint)flags >> 0x14 & 1) == 0) {
      PushOverrideID(0);
    }
    pIVar4 = (GImGui->TabBars).Data.Data;
    local_40 = -1;
    local_48 = (undefined1  [8])tab_bar;
    if ((pIVar4 <= tab_bar) && (tab_bar < pIVar4 + (GImGui->TabBars).Data.Size)) {
      local_40 = ImPool<ImGuiTabBar>::GetIndex(&GImGui->TabBars,tab_bar);
      local_48._0_4_ = 0.0;
      local_48._4_4_ = 0.0;
    }
    ImVector<ImGuiPtrOrIndex>::push_back(&pIVar5->CurrentTabBarStack,(ImGuiPtrOrIndex *)local_48);
    pIVar5->CurrentTabBar = tab_bar;
    iVar6 = tab_bar->CurrFrameVisible;
    if (iVar6 == pIVar5->FrameCount) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_widgets.cpp"
                    ,0x18b5,
                    "bool ImGui::BeginTabBarEx(ImGuiTabBar *, const ImRect &, ImGuiTabBarFlags)");
    }
    if (((((flags & 1U) != 0) && ((tab_bar->Flags & 1) == 0)) &&
        (__nmemb = (size_t)(tab_bar->Tabs).Size, 1 < (long)__nmemb)) &&
       (tab_bar->PrevFrameVisible != -1)) {
      qsort((tab_bar->Tabs).Data,__nmemb,0x20,TabItemComparerByVisibleOffset);
      iVar6 = tab_bar->CurrFrameVisible;
    }
    uVar7 = flags | 0x40;
    if ((flags & 0xc0U) != 0) {
      uVar7 = flags;
    }
    tab_bar->Flags = uVar7;
    IVar1 = tab_bar_bb->Max;
    (tab_bar->BarRect).Min = tab_bar_bb->Min;
    (tab_bar->BarRect).Max = IVar1;
    tab_bar->WantLayout = true;
    tab_bar->PrevFrameVisible = iVar6;
    tab_bar->CurrFrameVisible = pIVar5->FrameCount;
    tab_bar->FramePadding = (pIVar5->Style).FramePadding;
    local_48 = (undefined1  [8])
               ((ulong)(uint)((tab_bar->BarRect).Max.y - (tab_bar->BarRect).Min.y) << 0x20);
    ItemSize((ImVec2 *)local_48,0.0);
    (pIVar3->DC).CursorPos.x = (tab_bar->BarRect).Min.x;
    col = GetColorU32((uint)((uVar7 >> 0x15 & 1) == 0) * 2 + 0x23,1.0);
    fVar8 = (float)(int)((pIVar3->WindowPadding).x * 0.5);
    IVar1 = (tab_bar->BarRect).Max;
    local_48._4_4_ = IVar1.y + -1.0;
    local_38.y = (float)local_48._4_4_;
    local_38.x = fVar8 + IVar1.x;
    local_48._0_4_ = (tab_bar->BarRect).Min.x - fVar8;
    ImDrawList::AddLine(pIVar3->DrawList,(ImVec2 *)local_48,&local_38,col,1.0);
  }
  return (bool)(bVar2 ^ 1);
}

Assistant:

bool    ImGui::BeginTabBarEx(ImGuiTabBar* tab_bar, const ImRect& tab_bar_bb, ImGuiTabBarFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    if ((flags & ImGuiTabBarFlags_DockNode) == 0)
        PushOverrideID(tab_bar->ID);

    // Add to stack
    g.CurrentTabBarStack.push_back(GetTabBarRefFromTabBar(tab_bar));
    g.CurrentTabBar = tab_bar;

    if (tab_bar->CurrFrameVisible == g.FrameCount)
    {
        //IMGUI_DEBUG_LOG("BeginTabBarEx already called this frame\n", g.FrameCount);
        IM_ASSERT(0);
        return true;
    }

    // When toggling back from ordered to manually-reorderable, shuffle tabs to enforce the last visible order.
    // Otherwise, the most recently inserted tabs would move at the end of visible list which can be a little too confusing or magic for the user.
    if ((flags & ImGuiTabBarFlags_Reorderable) && !(tab_bar->Flags & ImGuiTabBarFlags_Reorderable) && tab_bar->Tabs.Size > 1 && tab_bar->PrevFrameVisible != -1)
        ImQsort(tab_bar->Tabs.Data, tab_bar->Tabs.Size, sizeof(ImGuiTabItem), TabItemComparerByVisibleOffset);

    // Flags
    if ((flags & ImGuiTabBarFlags_FittingPolicyMask_) == 0)
        flags |= ImGuiTabBarFlags_FittingPolicyDefault_;

    tab_bar->Flags = flags;
    tab_bar->BarRect = tab_bar_bb;
    tab_bar->WantLayout = true; // Layout will be done on the first call to ItemTab()
    tab_bar->PrevFrameVisible = tab_bar->CurrFrameVisible;
    tab_bar->CurrFrameVisible = g.FrameCount;
    tab_bar->FramePadding = g.Style.FramePadding;

    // Layout
    ItemSize(ImVec2(0.0f /*tab_bar->OffsetMax*/, tab_bar->BarRect.GetHeight())); // Don't feed width back
    window->DC.CursorPos.x = tab_bar->BarRect.Min.x;

    // Draw separator
    const ImU32 col = GetColorU32((flags & ImGuiTabBarFlags_IsFocused) ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive);
    const float y = tab_bar->BarRect.Max.y - 1.0f;
    {
        const float separator_min_x = tab_bar->BarRect.Min.x - ImFloor(window->WindowPadding.x * 0.5f);
        const float separator_max_x = tab_bar->BarRect.Max.x + ImFloor(window->WindowPadding.x * 0.5f);
        window->DrawList->AddLine(ImVec2(separator_min_x, y), ImVec2(separator_max_x, y), col, 1.0f);
    }
    return true;
}